

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::reset(QWizardPrivate *this)

{
  QObject *pQVar1;
  int *piVar2;
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar3;
  QWidget *this_00;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  long in_FS_OFFSET;
  int local_4c;
  QWizardPage *local_48;
  int *piStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->current != -1) {
    pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    local_4c = *(int *)(*(long *)(pQVar1 + 8) + 0x340);
    local_48 = (QWizardPage *)0x0;
    this_00 = &QMap<int,_QWizardPage_*>::value
                         ((QMap<int,_QWizardPage_*> *)(*(long *)(pQVar1 + 8) + 0x2e0),&local_4c,
                          &local_48)->super_QWidget;
    QWidget::hide(this_00);
    cleanupPagesNotInHistory(this);
    lVar6 = (this->history).d.size;
    if (lVar6 != 0) {
      piVar2 = (this->history).d.ptr;
      lVar6 = lVar6 << 2;
      do {
        (**(code **)(*(long *)pQVar1 + 0x1e0))(pQVar1,*(undefined4 *)((long)piVar2 + lVar6 + -4));
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
    }
    QList<int>::clear(&this->history);
    pQVar3 = (this->pageMap).d.d.ptr;
    if (pQVar3 == (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                   *)0x0) {
      p_Var4 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var4 = *(_Base_ptr *)
                ((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var5 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar3 == (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                   *)0x0) {
      p_Var5 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var4 != p_Var5; p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      *(undefined1 *)((long)&(p_Var4[1]._M_parent)->_M_parent[0x18]._M_parent + 6) = 0;
    }
    this->current = -1;
    local_4c = -1;
    local_48 = (QWizardPage *)0x0;
    piStack_40 = &local_4c;
    QMetaObject::activate(pQVar1,&QWizard::staticMetaObject,0,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::reset()
{
    Q_Q(QWizard);
    if (current != -1) {
        q->currentPage()->hide();
        cleanupPagesNotInHistory();
        const auto end = history.crend();
        for (auto it = history.crbegin(); it != end; ++it)
            q->cleanupPage(*it);
        history.clear();
        for (QWizardPage *page : std::as_const(pageMap))
            page->d_func()->initialized = false;

        current = -1;
        emit q->currentIdChanged(-1);
    }
}